

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_data.hpp
# Opt level: O2

void duckdb::ArrowScalarBaseData<duckdb::hugeint_t,_short,_duckdb::ArrowScalarConverter>::Append
               (ArrowAppendData *append_data,Vector *input,idx_t from,idx_t to,idx_t input_size)

{
  idx_t iVar1;
  ArrowBuffer *this;
  ulong uVar2;
  long lVar3;
  data_ptr_t pdVar4;
  long lVar5;
  idx_t i;
  hugeint_t hVar6;
  UnifiedVectorFormat format;
  UnifiedVectorFormat local_78;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(input,input_size,&local_78);
  AppendValidity(append_data,&local_78,from,to);
  this = ArrowAppendData::GetMainBuffer(append_data);
  lVar3 = to - from;
  ArrowBuffer::resize(this,lVar3 * 0x10 + this->count);
  pdVar4 = this->dataptr + 8;
  for (; from < to; from = from + 1) {
    uVar2 = from;
    if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
      uVar2 = (ulong)(local_78.sel)->sel_vector[from];
    }
    iVar1 = append_data->row_count;
    hVar6 = ArrowScalarConverter::Operation<duckdb::hugeint_t,short>
                      (*(short *)(local_78.data + uVar2 * 2));
    lVar5 = iVar1 * 0x10;
    *(uint64_t *)(pdVar4 + lVar5 + -8) = hVar6.lower;
    *(int64_t *)(pdVar4 + lVar5) = hVar6.upper;
    pdVar4 = pdVar4 + 0x10;
  }
  append_data->row_count = append_data->row_count + lVar3;
  UnifiedVectorFormat::~UnifiedVectorFormat(&local_78);
  return;
}

Assistant:

static void Append(ArrowAppendData &append_data, Vector &input, idx_t from, idx_t to, idx_t input_size) {
		D_ASSERT(to >= from);
		idx_t size = to - from;
		D_ASSERT(size <= input_size);
		UnifiedVectorFormat format;
		input.ToUnifiedFormat(input_size, format);

		// append the validity mask
		AppendValidity(append_data, format, from, to);

		// append the main data
		auto &main_buffer = append_data.GetMainBuffer();
		main_buffer.resize(main_buffer.size() + sizeof(TGT) * size);
		auto data = UnifiedVectorFormat::GetData<SRC>(format);
		auto result_data = main_buffer.GetData<TGT>();

		for (idx_t i = from; i < to; i++) {
			auto source_idx = format.sel->get_index(i);
			auto result_idx = append_data.row_count + i - from;

			if (OP::SkipNulls() && !format.validity.RowIsValid(source_idx)) {
				OP::template SetNull<TGT>(result_data[result_idx]);
				continue;
			}
			result_data[result_idx] = OP::template Operation<TGT, SRC>(data[source_idx]);
		}
		append_data.row_count += size;
	}